

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_quaternion rf_quaternion_invert(rf_quaternion q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  rf_quaternion rVar6;
  
  fVar2 = q.z;
  fVar4 = q.w;
  fVar3 = q.x;
  fVar5 = q.y;
  fVar1 = fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3 + fVar5 * fVar5;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = fVar1 * fVar1;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar4 = fVar4 * (1.0 / fVar1);
    fVar1 = -(1.0 / fVar1);
    fVar3 = fVar3 * fVar1;
    fVar5 = fVar5 * fVar1;
    fVar2 = fVar1 * fVar2;
  }
  rVar6.y = fVar5;
  rVar6.x = fVar3;
  rVar6.w = fVar4;
  rVar6.z = fVar2;
  return rVar6;
}

Assistant:

RF_API rf_quaternion rf_quaternion_invert(rf_quaternion q)
{
    rf_quaternion result = q;
    float length = rf_quaternion_len(q);
    float lengthSq = length * length;

    if (lengthSq != 0.0)
    {
        float i = 1.0f / lengthSq;

        result.x *= -i;
        result.y *= -i;
        result.z *= -i;
        result.w *= i;
    }

    return result;
}